

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

bool google::protobuf::internal::ExtensionSet::is_packable(WireType type)

{
  WireType type_local;
  
  if (WIRETYPE_FIXED64 < type) {
    if (type - WIRETYPE_LENGTH_DELIMITED < 3) {
      return false;
    }
    if (type != WIRETYPE_FIXED32) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.h"
                  ,0x3da);
    }
  }
  return true;
}

Assistant:

inline static bool is_packable(WireFormatLite::WireType type) {
    switch (type) {
      case WireFormatLite::WIRETYPE_VARINT:
      case WireFormatLite::WIRETYPE_FIXED64:
      case WireFormatLite::WIRETYPE_FIXED32:
        return true;
      case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
      case WireFormatLite::WIRETYPE_START_GROUP:
      case WireFormatLite::WIRETYPE_END_GROUP:
        return false;

        // Do not add a default statement. Let the compiler complain when
        // someone
        // adds a new wire type.
    }
    Unreachable();  // switch handles all possible enum values
    return false;
  }